

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osnoui.c
# Opt level: O3

int os_get_rel_path(char *result,size_t result_len,char *basepath,char *filename)

{
  char cVar1;
  char cVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  ulong __n;
  char *pcVar10;
  
  pcVar7 = (char *)0x0;
  pcVar4 = (char *)0x0;
  pcVar10 = filename;
  do {
    cVar1 = *pcVar10;
    cVar2 = *basepath;
    if (cVar1 == cVar2) {
      pcVar5 = basepath;
      pcVar8 = pcVar10;
      if ((cVar1 != '/') &&
         (pcVar6 = basepath, pcVar5 = pcVar4, pcVar9 = pcVar10, pcVar8 = pcVar7, cVar1 == '\0'))
      break;
      pcVar7 = pcVar8;
      pcVar4 = pcVar5;
      if (cVar2 == '\0') {
        if ((pcVar5 == (char *)0x0) || (pcVar8 == (char *)0x0)) goto LAB_00107785;
        goto LAB_001077a6;
      }
    }
    else {
      pcVar6 = pcVar4;
      pcVar9 = pcVar7;
      if ((cVar1 != '/') || (pcVar7 = pcVar10, pcVar4 = basepath, cVar2 != '/')) break;
    }
    pcVar10 = pcVar10 + 1;
    basepath = basepath + 1;
  } while( true );
  if (pcVar9 == (char *)0x0 || pcVar6 == (char *)0x0) {
LAB_00107785:
    strncpy(result,filename,result_len - 1);
    result[result_len - 1] = '\0';
    iVar3 = 0;
  }
  else {
    pcVar5 = pcVar6;
    pcVar8 = pcVar9;
    if (cVar2 == '\0') {
LAB_001077a6:
      if ((cVar1 == '/') || (pcVar6 = pcVar5, pcVar9 = pcVar8, cVar1 == '\0')) {
        pcVar6 = basepath;
        pcVar9 = pcVar10;
      }
    }
    pcVar6 = pcVar6 + (*pcVar6 != '\0');
    cVar1 = *pcVar9;
    __n = result_len - 1;
    cVar2 = *pcVar6;
    pcVar10 = result;
    while (cVar2 != '\0') {
      if (__n < 4) {
        __n = 0;
        break;
      }
      pcVar10[0] = '.';
      pcVar10[1] = '.';
      pcVar10[2] = '/';
      pcVar10 = pcVar10 + 3;
      __n = __n - 3;
      for (; (cVar2 = *pcVar6, cVar2 != '\0' && (cVar2 != '/')); pcVar6 = pcVar6 + 1) {
      }
      pcVar6 = pcVar6 + (cVar2 != '\0');
      cVar2 = *pcVar6;
    }
    strncpy(pcVar10,pcVar9 + (cVar1 != '\0'),__n);
    pcVar10[__n] = '\0';
    iVar3 = 1;
    if (*result == '\0') {
      pcVar10[0] = '.';
      pcVar10[1] = '\0';
    }
  }
  return iVar3;
}

Assistant:

int os_get_rel_path(char *result, size_t result_len,
                    const char *basepath, const char *filename)
{
    const char *fp;
    const char *bp;
    const char *fsep;
    const char *bsep;
    size_t rem;
    char *rp;

#if defined(MSDOS)
    /*
     *   DOS and some other systems (e.g., VMS) use drive letter, volume, or
     *   device prefixes, and each drive/volume/device is effectively its own
     *   separate namespace with its own root directory.  There's typically
     *   no syntax on these systems to refer to a container entity above the
     *   volume level, or the parent of a volume root, which means there's no
     *   way to write a filename in relative terms when it's on a different
     *   volume from the base path.
     *   
     *   So: start by checking for a drive/volume prefix.  If both paths have
     *   one (and they both should if the system uses them at all, as both
     *   paths are supposed to be handed to us in absolute format), make sure
     *   they match; if not, we can't form a relative name.
     */
    bp = oss_parse_volume(basepath);
    fp = oss_parse_volume(filename);
    if (bp != 0 && fp != 0
        && (bp - basepath != fp - filename
            || pathmemcmp(basepath, filename, bp - basepath) != 0))
    {
        /* we have volumes, and they don't match - we can't relativize it */
        strncpy(result, filename, result_len - 1);
        result[result_len - 1] = '\0';
        return FALSE;
    }
#endif

    /*
     *   Find the common path prefix.  We can lop off any leading elements
     *   that the two paths have in common.
     */
    for (fp = filename, bp = basepath, fsep = 0, bsep = 0 ;
         pathchareq(*fp, *bp) || (ispathchar(*fp) && ispathchar(*bp)) ;
         ++fp, ++bp)
    {
        /* 
         *   if this is a separator character, note it - we want to keep
         *   track of the last separator in the common portion, since this is
         *   the end of the common path prefix 
         */
        if (ispathchar(*fp) || *fp == '\0')
        {
            fsep = fp;
            bsep = bp;
        }

        /* stop at the end of the strings */
        if (*fp == '\0' || *bp == '\0')
            break;
    }

    /* if we didn't find any separators, we can't relativize the paths */
    if (bsep == 0 || fsep == 0)
    {
        /* nothing in common - return the filename unchanged */
        strncpy(result, filename, result_len - 1);
        result[result_len - 1] = '\0';
        return FALSE;
    }

    /*
     *   If we reached the end of the base path string, and we're at a path
     *   separator in the filename string, then the entire base path prefix
     *   is in common to both names.
     */
    if (*bp == '\0' && (ispathchar(*fp) || *fp == '\0'))
    {
        fsep = fp;
        bsep = bp;
    }

    /* if we're at a path separator in the base path, skip it */
    if (*bsep != '\0')
        ++bsep;

    /* if we're at a path separator in the filename, skip it */
    if (*fsep != '\0')
        ++fsep;

    /*
     *   Everything up to fsep and bsep can be dropped, because it's a common
     *   directory path prefix.  We must now add the relative adjustment
     *   portion: add a ".." directory for each remaining directory in the
     *   base path, since we must move from the base path up to the common
     *   ancestor; then add the rest of the filename path.
     */

    /* 
     *   first, set up to copy into the result buffer - leave space for null
     *   termination
     */
    rp = result;
    rem = result_len - 1;

    /* add a ".." for each remaining directory in the base path string */
    while (*bsep != '\0')
    {
        /* add ".." and a path separator */
        if (rem > 3)
        {
            *rp++ = '.';
            *rp++ = '.';
            *rp++ = OSPATHCHAR;
            rem -= 3;
        }
        else
        {
            /* no more room - give up */
            rem = 0;
            break;
        }

        /* scan to the next path separator */
        for ( ; *bsep != '\0' && !ispathchar(*bsep) ; ++bsep) ;

        /* if this is a path separator, skip it */
        if (*bsep != '\0')
            ++bsep;
    }

    /*
     *   Copy the remainder of the filename, or as much as will fit, and
     *   ensure that the result is properly null-terminated 
     */
    strncpy(rp, fsep, rem);
    rp[rem] = '\0';

    /* if the result is empty, return "." to represent the current dir */
    if (result[0] == '\0')
        strcpy(rp, ".");

    /* success */
    return TRUE;
}